

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_pclmul_template.h
# Opt level: O1

u32 crc32_x86_vpclmulqdq_avx512_vl256(u32 crc,u8 *p,size_t len)

{
  undefined1 auVar1 [32];
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint uVar15;
  ulong uVar16;
  size_t sVar17;
  ulong uVar18;
  undefined1 (*pauVar19) [16];
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar22 [16];
  
  auVar23 = ZEXT416(crc);
  if (0xff < len) {
    if ((0x10000 < len) && (((ulong)p & 0x1f) != 0)) {
      uVar15 = (uint)-(long)p;
      auVar23 = auVar23 ^ *(undefined1 (*) [16])p;
      uVar16 = (ulong)(uVar15 & 0x1f);
      pauVar19 = (undefined1 (*) [16])(p + 0x10);
      uVar20 = -(long)p & 0xf;
      uVar18 = uVar16;
      if (uVar20 != 0) {
        auVar21 = vpshufb_avx(auVar23,*(undefined1 (*) [16])(shift_tab + uVar20 + 0x10));
        auVar21 = vpblendvb_avx(auVar21,*(undefined1 (*) [16])(p + uVar20),
                                *(undefined1 (*) [16])(shift_tab + uVar20 + 0x10));
        auVar23 = vpshufb_avx(auVar23,*(undefined1 (*) [16])(shift_tab + uVar20));
        pauVar19 = (undefined1 (*) [16])(*pauVar19 + uVar20);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = auVar23._0_8_;
        auVar3 = (undefined1  [16])0x0;
        for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
          if ((auVar4 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
            auVar3 = auVar3 ^ ZEXT816(0xae689191) << uVar2;
          }
        }
        auVar10._8_8_ = 0;
        auVar10._0_8_ = auVar23._8_8_;
        auVar23 = (undefined1  [16])0x0;
        for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
          if ((auVar10 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
            auVar23 = auVar23 ^ ZEXT816(0xccaa009e) << uVar2;
          }
        }
        auVar23 = vpternlogq_avx512vl(auVar23,auVar3,auVar21,0x96);
        uVar18 = (ulong)(uVar15 & 0x10);
      }
      for (; uVar18 != 0; uVar18 = uVar18 - 0x10) {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = auVar23._0_8_;
        auVar21 = (undefined1  [16])0x0;
        for (uVar15 = 0; uVar15 < 0x40; uVar15 = uVar15 + 1) {
          if ((auVar3 & (undefined1  [16])0x1 << uVar15) != (undefined1  [16])0x0) {
            auVar21 = auVar21 ^ ZEXT816(0xae689191) << uVar15;
          }
        }
        auVar11._8_8_ = 0;
        auVar11._0_8_ = auVar23._8_8_;
        auVar23 = (undefined1  [16])0x0;
        for (uVar15 = 0; uVar15 < 0x40; uVar15 = uVar15 + 1) {
          if ((auVar11 & (undefined1  [16])0x1 << uVar15) != (undefined1  [16])0x0) {
            auVar23 = auVar23 ^ ZEXT816(0xccaa009e) << uVar15;
          }
        }
        auVar23 = vpternlogq_avx512vl(auVar23,auVar21,*pauVar19,0x96);
        pauVar19 = pauVar19 + 1;
      }
      len = len - uVar16;
    }
    if (0x1ff < len) {
      halt_baddata();
    }
    halt_baddata();
  }
  if (len < 0x20) {
    if (len < 0x10) {
      if (len < 4) {
        if (len != 0) {
          sVar17 = 0;
          uVar18 = (ulong)crc;
          do {
            crc = (uint)(uVar18 >> 8) ^ crc32_slice1_table[(uint)p[sVar17] ^ crc & 0xff];
            uVar18 = (ulong)crc;
            sVar17 = sVar17 + 1;
          } while (len != sVar17);
          return crc;
        }
        return crc;
      }
      uVar15 = ~(-1 << ((byte)len & 0x1f));
      auVar21 = vmovdqu8_avx512vl(*(undefined1 (*) [16])p);
      auVar22[1] = ((byte)(uVar15 >> 1) & 1) * auVar21[1];
      auVar22[0] = ((byte)uVar15 & 1) * auVar21[0];
      auVar22[2] = ((byte)(uVar15 >> 2) & 1) * auVar21[2];
      auVar22[3] = ((byte)(uVar15 >> 3) & 1) * auVar21[3];
      auVar22[4] = ((byte)(uVar15 >> 4) & 1) * auVar21[4];
      auVar22[5] = ((byte)(uVar15 >> 5) & 1) * auVar21[5];
      auVar22[6] = ((byte)(uVar15 >> 6) & 1) * auVar21[6];
      auVar22[7] = ((byte)(uVar15 >> 7) & 1) * auVar21[7];
      auVar22[8] = ((byte)(uVar15 >> 8) & 1) * auVar21[8];
      auVar22[9] = ((byte)(uVar15 >> 9) & 1) * auVar21[9];
      auVar22[10] = ((byte)(uVar15 >> 10) & 1) * auVar21[10];
      auVar22[0xb] = ((byte)(uVar15 >> 0xb) & 1) * auVar21[0xb];
      auVar22[0xc] = ((byte)(uVar15 >> 0xc) & 1) * auVar21[0xc];
      auVar22[0xd] = ((byte)(uVar15 >> 0xd) & 1) * auVar21[0xd];
      auVar22[0xe] = ((byte)(uVar15 >> 0xe) & 1) * auVar21[0xe];
      auVar22[0xf] = ((byte)(uVar15 >> 0xf) & 1) * auVar21[0xf];
      auVar23 = vpshufb_avx(auVar22 ^ auVar23,*(undefined1 (*) [16])(shift_tab + len));
      goto LAB_0010c6e1;
    }
    auVar23 = auVar23 ^ *(undefined1 (*) [16])p;
    pauVar19 = (undefined1 (*) [16])(p + 0x10);
  }
  else {
    auVar1 = ZEXT1632(auVar23) ^ *(undefined1 (*) [32])p;
    if (0x3f < len) {
      if (len < 0x80) {
        halt_baddata();
      }
      halt_baddata();
    }
    pauVar19 = (undefined1 (*) [16])(p + 0x20);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = auVar1._0_8_;
    auVar23 = (undefined1  [16])0x0;
    for (uVar15 = 0; uVar15 < 0x40; uVar15 = uVar15 + 1) {
      if ((auVar21 & (undefined1  [16])0x1 << uVar15) != (undefined1  [16])0x0) {
        auVar23 = auVar23 ^ ZEXT816(0xae689191) << uVar15;
      }
    }
    auVar12._8_8_ = 0;
    auVar12._0_8_ = auVar1._8_8_;
    auVar21 = (undefined1  [16])0x0;
    for (uVar15 = 0; uVar15 < 0x40; uVar15 = uVar15 + 1) {
      if ((auVar12 & (undefined1  [16])0x1 << uVar15) != (undefined1  [16])0x0) {
        auVar21 = auVar21 ^ ZEXT816(0xccaa009e) << uVar15;
      }
    }
    auVar23 = vpternlogq_avx512vl(auVar21,auVar23,auVar1._16_16_,0x96);
    if ((len & 0x10) != 0) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = auVar23._0_8_;
      auVar21 = (undefined1  [16])0x0;
      for (uVar15 = 0; uVar15 < 0x40; uVar15 = uVar15 + 1) {
        if ((auVar5 & (undefined1  [16])0x1 << uVar15) != (undefined1  [16])0x0) {
          auVar21 = auVar21 ^ ZEXT816(0xae689191) << uVar15;
        }
      }
      auVar13._8_8_ = 0;
      auVar13._0_8_ = auVar23._8_8_;
      auVar23 = (undefined1  [16])0x0;
      for (uVar15 = 0; uVar15 < 0x40; uVar15 = uVar15 + 1) {
        if ((auVar13 & (undefined1  [16])0x1 << uVar15) != (undefined1  [16])0x0) {
          auVar23 = auVar23 ^ ZEXT816(0xccaa009e) << uVar15;
        }
      }
      auVar23 = vpternlogq_avx512vl(auVar23,auVar21,*pauVar19,0x96);
      pauVar19 = (undefined1 (*) [16])(p + 0x30);
    }
  }
  uVar18 = len & 0xf;
  if (uVar18 != 0) {
    auVar21 = vpshufb_avx(auVar23,*(undefined1 (*) [16])(shift_tab + uVar18));
    auVar23 = vpshufb_avx(auVar23,*(undefined1 (*) [16])(shift_tab + uVar18 + 0x10));
    auVar23 = vpblendvb_avx(auVar23,*(undefined1 (*) [16])(pauVar19[-1] + uVar18),
                            *(undefined1 (*) [16])(shift_tab + uVar18 + 0x10));
    auVar6._8_8_ = 0;
    auVar6._0_8_ = auVar21._0_8_;
    auVar3 = (undefined1  [16])0x0;
    for (uVar15 = 0; uVar15 < 0x40; uVar15 = uVar15 + 1) {
      if ((auVar6 & (undefined1  [16])0x1 << uVar15) != (undefined1  [16])0x0) {
        auVar3 = auVar3 ^ ZEXT816(0xae689191) << uVar15;
      }
    }
    auVar14._8_8_ = 0;
    auVar14._0_8_ = auVar21._8_8_;
    auVar21 = (undefined1  [16])0x0;
    for (uVar15 = 0; uVar15 < 0x40; uVar15 = uVar15 + 1) {
      if ((auVar14 & (undefined1  [16])0x1 << uVar15) != (undefined1  [16])0x0) {
        auVar21 = auVar21 ^ ZEXT816(0xccaa009e) << uVar15;
      }
    }
    auVar23 = vpternlogq_avx512vl(auVar21,auVar3,auVar23,0x96);
  }
LAB_0010c6e1:
  auVar8._8_8_ = 0;
  auVar8._0_8_ = auVar23._0_8_;
  auVar21 = (undefined1  [16])0x0;
  for (uVar15 = 0; uVar15 < 0x40; uVar15 = uVar15 + 1) {
    if ((auVar8 & (undefined1  [16])0x1 << uVar15) != (undefined1  [16])0x0) {
      auVar21 = auVar21 ^ ZEXT816(0xccaa009e) << uVar15;
    }
  }
  auVar23 = vpsrldq_avx(auVar23,8);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = SUB168(auVar21 ^ auVar23,0);
  auVar23 = (undefined1  [16])0x0;
  for (uVar15 = 0; uVar15 < 0x40; uVar15 = uVar15 + 1) {
    if ((auVar7 & (undefined1  [16])0x1 << uVar15) != (undefined1  [16])0x0) {
      auVar23 = auVar23 ^ ZEXT816(0xb4e5b025f7011641) << uVar15;
    }
  }
  auVar9._8_8_ = 0;
  auVar9._0_8_ = auVar23._0_8_;
  auVar23 = (undefined1  [16])0x0;
  for (uVar15 = 0; uVar15 < 0x40; uVar15 = uVar15 + 1) {
    if ((auVar9 & (undefined1  [16])0x1 << uVar15) != (undefined1  [16])0x0) {
      auVar23 = auVar23 ^ ZEXT816(0x1db710641) << uVar15;
    }
  }
  return auVar21._8_4_ ^ auVar23._8_4_;
}

Assistant:

static ATTRIBUTES u32
ADD_SUFFIX(crc32_x86)(u32 crc, const u8 *p, size_t len)
{
	/*
	 * mults_{N}v are the vectors of multipliers for folding across N vec_t
	 * vectors, i.e. N*VL*8 bits.  mults_128b are the two multipliers for
	 * folding across 128 bits.  mults_128b differs from mults_1v when
	 * VL != 16.  All multipliers are 64-bit, to match what pclmulqdq needs,
	 * but since this is for CRC-32 only their low 32 bits are nonzero.
	 * For more details, see scripts/gen-crc32-consts.py.
	 */
	const vec_t mults_8v = MULTS_8V;
	const vec_t mults_4v = MULTS_4V;
	const vec_t mults_2v = MULTS_2V;
	const vec_t mults_1v = MULTS_1V;
	const __m128i mults_128b = _mm_set_epi64x(CRC32_X95_MODG, CRC32_X159_MODG);
	const __m128i barrett_reduction_constants =
		_mm_set_epi64x(CRC32_BARRETT_CONSTANT_2, CRC32_BARRETT_CONSTANT_1);
	vec_t v0, v1, v2, v3, v4, v5, v6, v7;
	__m128i x0 = _mm_cvtsi32_si128(crc);
	__m128i x1;

	if (len < 8*VL) {
		if (len < VL) {
			STATIC_ASSERT(VL == 16 || VL == 32 || VL == 64);
			if (len < 16) {
			#if USE_AVX512
				if (len < 4)
					return crc32_slice1(crc, p, len);
				/*
				 * Handle 4 <= len <= 15 bytes by doing a masked
				 * load, XOR'ing the current CRC with the first
				 * 4 bytes, left-shifting by '16 - len' bytes to
				 * align the result to the end of x0 (so that it
				 * becomes the low-order coefficients of a
				 * 128-bit polynomial), and then doing the usual
				 * reduction from 128 bits to 32 bits.
				 */
				x0 = _mm_xor_si128(
					x0, _mm_maskz_loadu_epi8((1 << len) - 1, p));
				x0 = _mm_shuffle_epi8(
					x0, _mm_loadu_si128((const void *)&shift_tab[len]));
				goto reduce_x0;
			#else
				return crc32_slice1(crc, p, len);
			#endif
			}
			/*
			 * Handle 16 <= len < VL bytes where VL is 32 or 64.
			 * Use 128-bit instructions so that these lengths aren't
			 * slower with VL > 16 than with VL=16.
			 */
			x0 = _mm_xor_si128(_mm_loadu_si128((const void *)p), x0);
			if (len >= 32) {
				x0 = fold_vec128(x0, _mm_loadu_si128((const void *)(p + 16)),
						 mults_128b);
				if (len >= 48)
					x0 = fold_vec128(x0, _mm_loadu_si128((const void *)(p + 32)),
							 mults_128b);
			}
			p += len & ~15;
			goto less_than_16_remaining;
		}
		v0 = VXOR(VLOADU(p), M128I_TO_VEC(x0));
		if (len < 2*VL) {
			p += VL;
			goto less_than_vl_remaining;
		}
		v1 = VLOADU(p + 1*VL);
		if (len < 4*VL) {
			p += 2*VL;
			goto less_than_2vl_remaining;
		}
		v2 = VLOADU(p + 2*VL);
		v3 = VLOADU(p + 3*VL);
		p += 4*VL;
	} else {
		/*
		 * If the length is large and the pointer is misaligned, align
		 * it.  For smaller lengths, just take the misaligned load
		 * penalty.  Note that on recent x86 CPUs, vmovdqu with an
		 * aligned address is just as fast as vmovdqa, so there's no
		 * need to use vmovdqa in the main loop.
		 */
		if (len > 65536 && ((uintptr_t)p & (VL-1))) {
			size_t align = -(uintptr_t)p & (VL-1);

			len -= align;
			x0 = _mm_xor_si128(_mm_loadu_si128((const void *)p), x0);
			p += 16;
			if (align & 15) {
				x0 = fold_lessthan16bytes(x0, p, align & 15,
							  mults_128b);
				p += align & 15;
				align &= ~15;
			}
			while (align) {
				x0 = fold_vec128(x0, *(const __m128i *)p,
						 mults_128b);
				p += 16;
				align -= 16;
			}
			v0 = M128I_TO_VEC(x0);
		#  if VL == 32
			v0 = _mm256_inserti128_si256(v0, *(const __m128i *)p, 1);
		#  elif VL == 64
			v0 = _mm512_inserti32x4(v0, *(const __m128i *)p, 1);
			v0 = _mm512_inserti64x4(v0, *(const __m256i *)(p + 16), 1);
		#  endif
			p -= 16;
		} else {
			v0 = VXOR(VLOADU(p), M128I_TO_VEC(x0));
		}
		v1 = VLOADU(p + 1*VL);
		v2 = VLOADU(p + 2*VL);
		v3 = VLOADU(p + 3*VL);
		v4 = VLOADU(p + 4*VL);
		v5 = VLOADU(p + 5*VL);
		v6 = VLOADU(p + 6*VL);
		v7 = VLOADU(p + 7*VL);
		p += 8*VL;

		/*
		 * This is the main loop, processing 8*VL bytes per iteration.
		 * 4*VL is usually enough and would result in smaller code, but
		 * Skylake and Cascade Lake need 8*VL to get full performance.
		 */
		while (len >= 16*VL) {
			v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_8v);
			v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_8v);
			v2 = fold_vec(v2, VLOADU(p + 2*VL), mults_8v);
			v3 = fold_vec(v3, VLOADU(p + 3*VL), mults_8v);
			v4 = fold_vec(v4, VLOADU(p + 4*VL), mults_8v);
			v5 = fold_vec(v5, VLOADU(p + 5*VL), mults_8v);
			v6 = fold_vec(v6, VLOADU(p + 6*VL), mults_8v);
			v7 = fold_vec(v7, VLOADU(p + 7*VL), mults_8v);
			p += 8*VL;
			len -= 8*VL;
		}

		/* Fewer than 8*VL bytes remain. */
		v0 = fold_vec(v0, v4, mults_4v);
		v1 = fold_vec(v1, v5, mults_4v);
		v2 = fold_vec(v2, v6, mults_4v);
		v3 = fold_vec(v3, v7, mults_4v);
		if (len & (4*VL)) {
			v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_4v);
			v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_4v);
			v2 = fold_vec(v2, VLOADU(p + 2*VL), mults_4v);
			v3 = fold_vec(v3, VLOADU(p + 3*VL), mults_4v);
			p += 4*VL;
		}
	}
	/* Fewer than 4*VL bytes remain. */
	v0 = fold_vec(v0, v2, mults_2v);
	v1 = fold_vec(v1, v3, mults_2v);
	if (len & (2*VL)) {
		v0 = fold_vec(v0, VLOADU(p + 0*VL), mults_2v);
		v1 = fold_vec(v1, VLOADU(p + 1*VL), mults_2v);
		p += 2*VL;
	}
less_than_2vl_remaining:
	/* Fewer than 2*VL bytes remain. */
	v0 = fold_vec(v0, v1, mults_1v);
	if (len & VL) {
		v0 = fold_vec(v0, VLOADU(p), mults_1v);
		p += VL;
	}
less_than_vl_remaining:
	/*
	 * Fewer than VL bytes remain.  Reduce v0 (length VL bytes) to x0
	 * (length 16 bytes) and fold in any 16-byte data segments that remain.
	 */
#if VL == 16
	x0 = v0;
#else
	{
	#if VL == 32
		__m256i y0 = v0;
	#else
		const __m256i mults_256b =
			_mm256_set_epi64x(CRC32_X223_MODG, CRC32_X287_MODG,
					  CRC32_X223_MODG, CRC32_X287_MODG);
		__m256i y0 = fold_vec256(_mm512_extracti64x4_epi64(v0, 0),
					 _mm512_extracti64x4_epi64(v0, 1),
					 mults_256b);
		if (len & 32) {
			y0 = fold_vec256(y0, _mm256_loadu_si256((const void *)p),
					 mults_256b);
			p += 32;
		}
	#endif
		x0 = fold_vec128(_mm256_extracti128_si256(y0, 0),
				 _mm256_extracti128_si256(y0, 1), mults_128b);
	}
	if (len & 16) {
		x0 = fold_vec128(x0, _mm_loadu_si128((const void *)p),
				 mults_128b);
		p += 16;
	}
#endif
less_than_16_remaining:
	len &= 15;

	/* Handle any remainder of 1 to 15 bytes. */
	if (len)
		x0 = fold_lessthan16bytes(x0, p, len, mults_128b);
#if USE_AVX512
reduce_x0:
#endif
	/*
	 * Multiply the remaining 128-bit message polynomial 'x0' by x^32, then
	 * reduce it modulo the generator polynomial G.  This gives the CRC.
	 *
	 * This implementation matches that used in crc-pclmul-template.S from
	 * https://lore.kernel.org/r/20250210174540.161705-4-ebiggers@kernel.org/
	 * with the parameters n=32 and LSB_CRC=1 (what the gzip CRC uses).  See
	 * there for a detailed explanation of the math used here.
	 */
	x0 = _mm_xor_si128(_mm_clmulepi64_si128(x0, mults_128b, 0x10),
			   _mm_bsrli_si128(x0, 8));
	x1 = _mm_clmulepi64_si128(x0, barrett_reduction_constants, 0x00);
	x1 = _mm_clmulepi64_si128(x1, barrett_reduction_constants, 0x10);
	x0 = _mm_xor_si128(x0, x1);
	return _mm_extract_epi32(x0, 2);
}